

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.c
# Opt level: O2

void * pack_thread(void *pargs)

{
  int iVar1;
  DIR *__dirp;
  dirent *pdVar2;
  ssize_t sVar3;
  char *__format;
  stat st;
  char parent [256];
  char parent_file [1024];
  char host [1024];
  
  __dirp = opendir(*(char **)((long)pargs + 0x38));
  if (__dirp == (DIR *)0x0) {
    fprintf(_stderr,"cannot open %s\n",*(undefined8 *)((long)pargs + 0x38));
  }
  else {
LAB_00102d63:
    pdVar2 = readdir(__dirp);
    if (pdVar2 != (dirent *)0x0) {
      if ((pdVar2->d_name[0] != '.') ||
         ((pdVar2->d_name[1] != '\0' && ((pdVar2->d_name[1] != '.' || (pdVar2->d_name[2] != '\0'))))
         )) {
        snprintf(host,0x400,"%s/%s",*(undefined8 *)((long)pargs + 0x38),pdVar2->d_name);
        iVar1 = stat(host,(stat *)&st);
        if (iVar1 < 0) {
          fwrite("internal error\n",0xf,1,_stderr);
          goto LAB_00102f05;
        }
        if ((st.st_mode & 0xf000) == 0x4000) {
          snprintf(parent_file,0x400,"%s/%s",host,"VITA_PATH.TXT");
          iVar1 = open(parent_file,0);
          if (-1 < iVar1) {
            sVar3 = read_block(iVar1,parent,0xff);
            if (sVar3 < 0) {
              fprintf(_stderr,"error reading %s\n",parent_file);
              goto LAB_00102f05;
            }
            close(iVar1);
            parent[sVar3] = '\0';
            printf("adding files for %s\n",parent);
            sVar3 = add_all_files(*(int *)((long)pargs + 4),parent,"",host);
            if (sVar3 < 0) goto LAB_00102f05;
            *(long *)((long)pargs + 0x40) = *(long *)((long)pargs + 0x40) + sVar3;
            goto LAB_00102d63;
          }
          __format = "WARNING: skipping %s because VITA_PATH.TXT is not found!\n";
        }
        else {
          __format = "WARNING: skipping %s because it is not a directory!\n";
        }
        fprintf(_stderr,__format,host);
      }
      goto LAB_00102d63;
    }
LAB_00102f05:
    closedir(__dirp);
  }
  close(*(int *)((long)pargs + 4));
  close(*pargs);
  return (void *)0x0;
}

Assistant:

void *pack_thread(void *pargs) {
  args_t *args = (args_t *)pargs;
  DIR *dir;
  struct dirent *dent;
  struct stat st;
  char parent[256];
  char host[MAX_PATH_LEN];
  char parent_file[MAX_PATH_LEN];
  int fd;
  ssize_t rd, wr;
  
  if ((dir = opendir(args->prefix)) == NULL) {
    fprintf(stderr, "cannot open %s\n", args->prefix);
    goto end2;
  }

  while ((dent = readdir(dir)) != NULL) {
    if (strcmp(dent->d_name, ".") == 0 || strcmp(dent->d_name, "..") == 0) {
      continue;
    }

#ifdef __APPLE__
    if (strcmp(dent->d_name, ".DS_Store") == 0) {
      continue; // ignore annoying OSX specific files
    }
#endif

    snprintf(host, sizeof(host), "%s/%s", args->prefix, dent->d_name);
    if (stat(host, &st) < 0) {
      fprintf(stderr, "internal error\n");
      goto end;
    }

    if (S_ISDIR(st.st_mode)) {
      snprintf(parent_file, sizeof(parent_file), "%s/%s", host, "VITA_PATH.TXT");
      if ((fd = open(parent_file, O_RDONLY | O_BINARY)) < 0) {
        fprintf(stderr, "WARNING: skipping %s because VITA_PATH.TXT is not found!\n", host);
        continue;
      }
      if ((rd = read_block(fd, parent, sizeof(parent)-1)) < 0) {
        fprintf(stderr, "error reading %s\n", parent_file);
        goto end;
      }
      close(fd);
      parent[rd] = '\0';
      dent = NULL; // so we don't actually reuse it
      printf("adding files for %s\n", parent);
      if ((wr = add_all_files(args->out, parent, "\0", host)) < 0) {
        goto end;
      }
      args->content_size += wr;
    } else {
      fprintf(stderr, "WARNING: skipping %s because it is not a directory!\n", host);
    }
  }
  
end:
  closedir(dir);
end2:
  close(args->out);
  close(args->in);
  return NULL;
}